

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

string * formatHex_abi_cxx11_(string *__return_storage_ptr__,int value)

{
  stringstream s;
  long local_1a0 [2];
  ostream local_190 [8];
  uint local_188 [26];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  *(uint *)((long)local_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)local_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
  std::ostream::operator<<(local_190,value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

const std::string formatHex (int value)
{
  std::stringstream s;
  s.setf (std::ios::hex, std::ios::basefield);
  s << value;
  return s.str ();
}